

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O2

vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
* deqp::gles31::Functional::anon_unknown_0::generateBasic2DCaseIterations
            (vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
             *__return_storage_ptr__,GatherType gatherType,TextureFormat *textureFormat,
            IVec2 *offsetRange)

{
  int iVar1;
  int iVar2;
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  *this;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  value_type local_8c;
  ulong local_68;
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  *local_60;
  int local_58;
  GatherType local_54;
  IVec2 *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_38 = (ulong)(-(uint)((textureFormat->order - D & 0xfffffffd) == 0) | 0xfffffffb);
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar6 = 0xffffffffffffffff;
  local_40 = (ulong)gatherType;
  local_60 = __return_storage_ptr__;
  local_54 = gatherType;
  local_50 = offsetRange;
  while( true ) {
    iVar5 = (int)uVar6;
    if ((int)local_38 + iVar5 == -1) break;
    if (local_54 < GATHERTYPE_LAST) {
      local_8c.componentNdx = iVar5;
      switch((long)&switchD_01375d8b::switchdataD_018cf510 +
             (long)(int)(&switchD_01375d8b::switchdataD_018cf510)[local_40]) {
      case 0x1375d8d:
        local_8c.offsets[2].m_data[0] = 0;
        local_8c.offsets[2].m_data[1] = 0;
        local_8c.offsets[3].m_data[0] = 0;
        local_8c.offsets[3].m_data[1] = 0;
        local_8c.offsets[0].m_data[0] = 0;
        local_8c.offsets[0].m_data[1] = 0;
        local_8c.offsets[1].m_data[0] = 0;
        local_8c.offsets[1].m_data[1] = 0;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_8c);
        __return_storage_ptr__ = local_60;
        break;
      case 0x1375da6:
        local_8c.offsets[2].m_data[0] = 0;
        local_8c.offsets[2].m_data[1] = 0;
        local_8c.offsets[3].m_data[0] = 0;
        local_8c.offsets[3].m_data[1] = 0;
        local_8c.offsets[0].m_data[0] = 0;
        local_8c.offsets[0].m_data[1] = 0;
        local_8c.offsets[1].m_data[0] = 0;
        local_8c.offsets[1].m_data[1] = 0;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_8c);
        __return_storage_ptr__ = local_60;
        break;
      case 0x1375dbf:
        iVar1 = local_50->m_data[0];
        iVar2 = local_50->m_data[1];
        local_8c.offsets[1].m_data = *&local_50->m_data;
        iVar3 = -iVar1;
        if (0 < iVar1) {
          iVar3 = iVar1;
        }
        local_68 = CONCAT44(local_68._4_4_,iVar3 / 2);
        iVar3 = iVar1 >> 0x1f;
        if (0 < iVar1) {
          iVar3 = 1;
        }
        iVar4 = -iVar2;
        if (0 < iVar2) {
          iVar4 = iVar2;
        }
        iVar7 = iVar2 >> 0x1f;
        if (0 < iVar2) {
          iVar7 = 1;
        }
        local_8c.offsets[0].m_data[1] = iVar1;
        local_8c.offsets[0].m_data[0] = iVar1;
        local_8c.offsets[2].m_data[1] = iVar1;
        local_8c.offsets[2].m_data[0] = iVar2;
        local_8c.offsets[3].m_data[1] = iVar2;
        local_8c.offsets[3].m_data[0] = iVar2;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_8c);
        __return_storage_ptr__ = local_60;
        if (iVar5 == -1) {
          uVar8 = (iVar4 / 2) * iVar7;
          local_8c.offsets[3].m_data[1] = 0;
          local_8c.offsets[3].m_data[0] = uVar8;
          local_8c.offsets[2].m_data = local_8c.offsets[3].m_data << 0x20;
          local_8c.offsets[0].m_data[1] = uVar8;
          local_8c.offsets[1].m_data[1] = iVar2;
          local_8c.offsets[1].m_data[0] = (int)local_68 * iVar3;
          local_8c.componentNdx = iVar5;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
          ::push_back(local_60,&local_8c);
          __return_storage_ptr__ = local_60;
        }
        break;
      case 0x1375ea9:
        iVar1 = local_50->m_data[0];
        iVar2 = local_50->m_data[1];
        local_8c.offsets[0].m_data = *&local_50->m_data;
        local_58 = -iVar1;
        if (0 < iVar1) {
          local_58 = iVar1;
        }
        local_58 = local_58 / 2;
        iVar3 = iVar1 >> 0x1f;
        if (0 < iVar1) {
          iVar3 = 1;
        }
        iVar4 = -iVar2;
        if (0 < iVar2) {
          iVar4 = iVar2;
        }
        local_48 = (long)iVar4 / 2 & 0xffffffff;
        iVar4 = iVar2 >> 0x1f;
        if (0 < iVar2) {
          iVar4 = 1;
        }
        local_8c.offsets[1].m_data[0] = 0;
        local_8c.offsets[1].m_data[1] = 0;
        local_8c.offsets[2].m_data[0] = 0;
        local_8c.offsets[2].m_data[1] = 0;
        local_8c.offsets[3].m_data[0] = 0;
        local_8c.offsets[3].m_data[1] = 0;
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
        ::push_back(__return_storage_ptr__,&local_8c);
        this = local_60;
        __return_storage_ptr__ = local_60;
        if (iVar5 == -1) {
          local_8c.offsets[0].m_data[1] = iVar1;
          local_8c.offsets[0].m_data[0] = iVar1;
          local_8c.offsets[1].m_data[0] = 0;
          local_8c.offsets[1].m_data[1] = 0;
          local_8c.offsets[2].m_data[0] = 0;
          local_8c.offsets[2].m_data[1] = 0;
          local_8c.offsets[3].m_data[0] = 0;
          local_8c.offsets[3].m_data[1] = 0;
          local_8c.componentNdx = iVar5;
          local_68 = uVar6;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
          ::push_back(local_60,&local_8c);
          local_8c.componentNdx = (int)local_68;
          local_8c.offsets[0].m_data[0] = iVar2;
          local_8c.offsets[1].m_data[0] = 0;
          local_8c.offsets[1].m_data[1] = 0;
          local_8c.offsets[2].m_data[0] = 0;
          local_8c.offsets[2].m_data[1] = 0;
          local_8c.offsets[3].m_data[0] = 0;
          local_8c.offsets[3].m_data[1] = 0;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
          ::push_back(this,&local_8c);
          local_8c.componentNdx = (int)local_68;
          local_8c.offsets[0].m_data[1] = iVar2;
          local_8c.offsets[1].m_data[0] = 0;
          local_8c.offsets[1].m_data[1] = 0;
          local_8c.offsets[2].m_data[0] = 0;
          local_8c.offsets[2].m_data[1] = 0;
          local_8c.offsets[3].m_data[0] = 0;
          local_8c.offsets[3].m_data[1] = 0;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
          ::push_back(this,&local_8c);
          local_8c.componentNdx = (int)local_68;
          local_8c.offsets[0].m_data = (int  [2])((ulong)(uint)((int)local_48 * iVar4) << 0x20);
          local_8c.offsets[1].m_data[0] = 0;
          local_8c.offsets[1].m_data[1] = 0;
          local_8c.offsets[2].m_data[0] = 0;
          local_8c.offsets[2].m_data[1] = 0;
          local_8c.offsets[3].m_data[0] = 0;
          local_8c.offsets[3].m_data[1] = 0;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
          ::push_back(this,&local_8c);
          local_8c.offsets[0].m_data[0] = local_58 * iVar3;
          local_8c.componentNdx = (int)local_68;
          local_8c.offsets[0].m_data[1] = 0;
          local_8c.offsets[1].m_data[0] = 0;
          local_8c.offsets[1].m_data[1] = 0;
          local_8c.offsets[2].m_data[0] = 0;
          local_8c.offsets[2].m_data[1] = 0;
          local_8c.offsets[3].m_data[0] = 0;
          local_8c.offsets[3].m_data[1] = 0;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
          ::push_back(this,&local_8c);
          uVar6 = local_68;
          local_8c.componentNdx = (int)local_68;
          local_8c.offsets[2].m_data[0] = 0;
          local_8c.offsets[2].m_data[1] = 0;
          local_8c.offsets[3].m_data[0] = 0;
          local_8c.offsets[3].m_data[1] = 0;
          local_8c.offsets[0].m_data[0] = 0;
          local_8c.offsets[0].m_data[1] = 0;
          local_8c.offsets[1].m_data[0] = 0;
          local_8c.offsets[1].m_data[1] = 0;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
          ::push_back(this,&local_8c);
          __return_storage_ptr__ = local_60;
        }
      }
    }
    uVar6 = (ulong)((int)uVar6 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<GatherArgs> generateBasic2DCaseIterations (GatherType gatherType, const tcu::TextureFormat& textureFormat, const IVec2& offsetRange)
{
	const int			numComponentCases	= isDepthFormat(textureFormat) ? 1 : 4+1; // \note For non-depth textures, test explicit components 0 to 3 and implicit component 0.
	vector<GatherArgs>	result;

	for (int componentCaseNdx = 0; componentCaseNdx < numComponentCases; componentCaseNdx++)
	{
		const int componentNdx = componentCaseNdx - 1;

		switch (gatherType)
		{
			case GATHERTYPE_BASIC:
				result.push_back(GatherArgs(componentNdx));
				break;

			case GATHERTYPE_OFFSET:
			{
				const int min	= offsetRange.x();
				const int max	= offsetRange.y();
				const int hmin	= divRoundToZero(min, 2);
				const int hmax	= divRoundToZero(max, 2);

				result.push_back(GatherArgs(componentNdx, IVec2(min, max)));

				if (componentCaseNdx == 0) // Don't test all offsets variants for all color components (they should be pretty orthogonal).
				{
					result.push_back(GatherArgs(componentNdx, IVec2(min,	min)));
					result.push_back(GatherArgs(componentNdx, IVec2(max,	min)));
					result.push_back(GatherArgs(componentNdx, IVec2(max,	max)));

					result.push_back(GatherArgs(componentNdx, IVec2(0,		hmax)));
					result.push_back(GatherArgs(componentNdx, IVec2(hmin,	0)));
					result.push_back(GatherArgs(componentNdx, IVec2(0,		0)));
				}

				break;
			}

			case GATHERTYPE_OFFSET_DYNAMIC:
				result.push_back(GatherArgs(componentNdx));
				break;

			case GATHERTYPE_OFFSETS:
			{
				const int min	= offsetRange.x();
				const int max	= offsetRange.y();
				const int hmin	= divRoundToZero(min, 2);
				const int hmax	= divRoundToZero(max, 2);

				result.push_back(GatherArgs(componentNdx,
											IVec2(min,	min),
											IVec2(min,	max),
											IVec2(max,	min),
											IVec2(max,	max)));

				if (componentCaseNdx == 0) // Don't test all offsets variants for all color components (they should be pretty orthogonal).
					result.push_back(GatherArgs(componentNdx,
												IVec2(min,	hmax),
												IVec2(hmin,	max),
												IVec2(0,	hmax),
												IVec2(hmax,	0)));
				break;
			}

			default:
				DE_ASSERT(false);
		}
	}

	return result;
}